

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O3

int uv_thread_create(uv_thread_t *tid,_func_void_void_ptr *entry,void *arg)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  undefined8 __stacksize;
  pthread_attr_t attr_storage;
  pthread_attr_t local_58;
  
  iVar1 = getrlimit(RLIMIT_STACK,(rlimit *)&local_58);
  if (iVar1 != 0) goto LAB_004c4159;
  if (local_58.__align == 0xffffffffffffffff) {
LAB_004c40eb:
    __stacksize = 0x200000;
  }
  else {
    iVar1 = getpagesize();
    uVar3 = local_58.__align - (ulong)local_58.__align % (ulong)(long)iVar1;
    local_58.__align = uVar3;
    uVar2 = __sysconf(0x4b);
    if (uVar3 < uVar2) goto LAB_004c40eb;
    __stacksize = local_58.__align;
    if (local_58.__align == 0) {
      iVar1 = pthread_create(tid,(pthread_attr_t *)0x0,(__start_routine *)entry,arg);
      goto LAB_004c4135;
    }
  }
  iVar1 = pthread_attr_init(&local_58);
  if (iVar1 == 0) {
    iVar1 = pthread_attr_setstacksize(&local_58,__stacksize);
    if (iVar1 == 0) {
      iVar1 = pthread_create(tid,&local_58,(__start_routine *)entry,arg);
      pthread_attr_destroy(&local_58);
LAB_004c4135:
      return -iVar1;
    }
  }
LAB_004c4159:
  abort();
}

Assistant:

int uv_thread_create(uv_thread_t *tid, void (*entry)(void *arg), void *arg) {
  int err;
  size_t stack_size;
  pthread_attr_t* attr;
  pthread_attr_t attr_storage;

  attr = NULL;
  stack_size = thread_stack_size();

  if (stack_size > 0) {
    attr = &attr_storage;

    if (pthread_attr_init(attr))
      abort();

    if (pthread_attr_setstacksize(attr, stack_size))
      abort();
  }

  err = pthread_create(tid, attr, (void*(*)(void*)) entry, arg);

  if (attr != NULL)
    pthread_attr_destroy(attr);

  return UV__ERR(err);
}